

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::transient_rrb<int,_false,_6>_> * __thiscall
immutable::ref<immutable::transient_rrb<int,_false,_6>_>::operator=
          (ref<immutable::transient_rrb<int,_false,_6>_> *this,
          ref<immutable::transient_rrb<int,_false,_6>_> *r)

{
  ref<immutable::transient_rrb<int,_false,_6>_> local_20;
  ref<immutable::transient_rrb<int,_false,_6>_> temp;
  ref<immutable::transient_rrb<int,_false,_6>_> *r_local;
  ref<immutable::transient_rrb<int,_false,_6>_> *this_local;
  
  temp.ptr = (transient_rrb<int,_false,_6> *)r;
  ref(&local_20,r);
  swap(this,&local_20);
  ~ref(&local_20);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }